

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeAtomicCmpxchg
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,uint bytes,Address offset,
          Type type,Name mem)

{
  __index_type *this_00;
  AtomicCmpxchg *expr;
  bool bVar1;
  optional<wasm::Type> type_00;
  Ok local_119;
  size_t local_118;
  char *local_110;
  IRBuilder *local_108;
  uintptr_t local_100;
  uint local_f4;
  Err local_f0;
  Err *local_c0;
  Err *err;
  undefined1 local_b0;
  undefined3 uStack_af;
  ChildPopper local_a8;
  undefined1 local_a0 [8];
  Result<wasm::Ok> _val;
  AtomicCmpxchg curr;
  uint bytes_local;
  IRBuilder *this_local;
  Type type_local;
  Address offset_local;
  
  this_00 = &_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index;
  curr.memory.super_IString.str._M_str._4_4_ = bytes;
  this_local = (IRBuilder *)type.id;
  type_local.id = offset.addr;
  AtomicCmpxchg::AtomicCmpxchg((AtomicCmpxchg *)this_00);
  wasm::Name::operator=((Name *)&curr.replacement,&mem);
  ChildPopper::ChildPopper(&local_a8,this);
  std::optional<wasm::Type>::optional<wasm::Type_&,_true>
            ((optional<wasm::Type> *)&err,(Type *)&this_local);
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._12_4_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)err;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_b0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_3_ = uStack_af;
  ChildPopper::visitAtomicCmpxchg
            ((Result<wasm::Ok> *)local_a0,&local_a8,(AtomicCmpxchg *)this_00,type_00);
  local_c0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_a0);
  bVar1 = local_c0 != (Err *)0x0;
  if (bVar1) {
    wasm::Err::Err(&local_f0,local_c0);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_f0);
    wasm::Err::~Err(&local_f0);
  }
  local_f4 = (uint)bVar1;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_a0);
  if (local_f4 == 0) {
    local_100 = type_local.id;
    local_108 = this_local;
    local_118 = mem.super_IString.str._M_len;
    local_110 = mem.super_IString.str._M_str;
    expr = Builder::makeAtomicCmpxchg
                     (&this->builder,curr.memory.super_IString.str._M_str._4_4_,
                      (Address)type_local.id,(Expression *)curr.offset.addr,curr.ptr,curr.expected,
                      (Type)this_local,mem);
    push(this,(Expression *)expr);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_119);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeAtomicCmpxchg(unsigned bytes,
                                      Address offset,
                                      Type type,
                                      Name mem) {
  AtomicCmpxchg curr;
  curr.memory = mem;
  CHECK_ERR(ChildPopper{*this}.visitAtomicCmpxchg(&curr, type));
  push(builder.makeAtomicCmpxchg(
    bytes, offset, curr.ptr, curr.expected, curr.replacement, type, mem));
  return Ok{};
}